

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::contextMenuEvent
          (QGraphicsScene *this,QGraphicsSceneContextMenuEvent *contextMenuEvent)

{
  bool bVar1;
  QGraphicsScenePrivate *pos;
  const_iterator o;
  QGraphicsItem **ppQVar2;
  QGraphicsItemPrivate *this_00;
  QPointF *__addr_len;
  sockaddr *__addr;
  int __fd;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QPointF *in_stack_ffffffffffffff48;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff50;
  QGraphicsSceneContextMenuEvent *in_stack_ffffffffffffff58;
  QWidget *viewport;
  QGraphicsItemPrivate *this_01;
  QGraphicsItem *item_00;
  QGraphicsScenePrivate *this_02;
  undefined1 in_stack_ffffffffffffff90 [16];
  undefined1 in_stack_ffffffffffffffa0 [16];
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  QGraphicsItem local_20;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos = d_func((QGraphicsScene *)0x9d1ab0);
  QEvent::ignore((QEvent *)in_RSI);
  local_20._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d_ptr.d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = pos;
  local_28 = QGraphicsSceneContextMenuEvent::screenPos
                       ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffff50);
  local_38 = QGraphicsSceneContextMenuEvent::scenePos(in_stack_ffffffffffffff58);
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d1b2e);
  __addr_len = &local_38;
  QGraphicsScenePrivate::itemsAtPosition
            (in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
             in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_);
  item_00 = &local_20;
  local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff50);
  o = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff50);
  while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_40,o), bVar1) {
    ppQVar2 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_40);
    this_01 = (QGraphicsItemPrivate *)*ppQVar2;
    viewport = in_RSI;
    this_00 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                          *)&this_01->extras);
    QGraphicsSceneContextMenuEvent::scenePos((QGraphicsSceneContextMenuEvent *)viewport);
    QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d1c16);
    QGraphicsItemPrivate::genericMapFromScene(this_01,(QPointF *)pos,viewport);
    __fd = (int)&stack0xffffffffffffffa0;
    QGraphicsSceneContextMenuEvent::setPos
              ((QGraphicsSceneContextMenuEvent *)this_00,in_stack_ffffffffffffff48);
    QEvent::accept((QEvent *)in_RSI,__fd,__addr,(socklen_t *)__addr_len);
    bVar1 = QGraphicsScenePrivate::sendEvent(this_02,item_00,(QEvent *)this_01);
    if ((!bVar1) || (bVar1 = QEvent::isAccepted((QEvent *)in_RSI), bVar1)) break;
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_40);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d1c97);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::contextMenuEvent(QGraphicsSceneContextMenuEvent *contextMenuEvent)
{
    Q_D(QGraphicsScene);
    // Ignore by default.
    contextMenuEvent->ignore();

    // Send the event to all items at this position until one item accepts the
    // event.
    const auto items = d->itemsAtPosition(contextMenuEvent->screenPos(),
                                          contextMenuEvent->scenePos(),
                                          contextMenuEvent->widget());
    for (QGraphicsItem *item : items) {
        contextMenuEvent->setPos(item->d_ptr->genericMapFromScene(contextMenuEvent->scenePos(),
                                                                  contextMenuEvent->widget()));
        contextMenuEvent->accept();
        if (!d->sendEvent(item, contextMenuEvent))
            break;

        if (contextMenuEvent->isAccepted())
            break;
    }
}